

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O1

void __thiscall
GibbsSamplerFromHDP::writeParameters
          (GibbsSamplerFromHDP *this,string *thetaFilename,string *phiFilename)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  pcVar1 = (thetaFilename->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + thetaFilename->_M_string_length);
  outputVector<double>(&this->_thetaEx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pcVar1 = (phiFilename->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + phiFilename->_M_string_length);
  outputVector<double>(&this->_phiEx,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::writeParameters(string thetaFilename, string phiFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
}